

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FuchsiaZoneInfoSource::
~FuchsiaZoneInfoSource(FuchsiaZoneInfoSource *this)

{
  FuchsiaZoneInfoSource *this_local;
  
  ~FuchsiaZoneInfoSource(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

std::string Version() const override { return version_; }